

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Diag
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  long lVar1;
  complex<float> *pcVar2;
  complex<float> *pcVar3;
  _ComplexT _Var4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long local_40;
  int extraout_var_00;
  
  lVar6 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar7 = 0;
  if ((lVar6 == CONCAT44(extraout_var,iVar5)) &&
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed == '\x04')) {
    iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    lVar6 = CONCAT44(extraout_var_00,iVar5);
    iVar7 = 1;
    if ((lVar6 != 0) && (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
      local_40 = 0;
      lVar10 = 0;
      do {
        lVar9 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        if (lVar9 < 1) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar6 != 0 && -1 < extraout_var_00) {
          lVar9 = lVar9 * local_40;
          pcVar2 = B->fElem;
          lVar8 = 0;
          do {
            lVar1 = lVar8 + 1;
            pcVar3 = (this->fElem).fStore[lVar8];
            _Var4 = __divsc3((int)*(_ComplexT *)((long)&pcVar2[lVar8]._M_value + lVar9),
                             *(undefined4 *)((long)&pcVar2[lVar8]._M_value + lVar9 + 4),
                             (int)pcVar3->_M_value,*(undefined4 *)((long)&pcVar3->_M_value + 4));
            *(_ComplexT *)((long)&pcVar2[lVar8]._M_value + lVar9) = _Var4;
            lVar8 = lVar1;
          } while (lVar6 != lVar1);
        }
        lVar10 = lVar10 + 1;
        local_40 = local_40 + 8;
      } while (lVar10 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}